

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_ComponentStatus __thiscall ON_SubDComponentPtr::Status(ON_SubDComponentPtr *this)

{
  Type TVar1;
  ulong uVar2;
  ON_ComponentStatus *pOVar3;
  bool bVar4;
  
  TVar1 = ComponentType(this);
  pOVar3 = &ON_ComponentStatus::NoneSet;
  if (TVar1 == Face) {
    uVar2 = this->m_ptr;
    bVar4 = (~(uint)uVar2 & 6) == 0;
  }
  else if (TVar1 == Edge) {
    uVar2 = this->m_ptr;
    bVar4 = ((uint)uVar2 & 6) == 4;
  }
  else {
    if (TVar1 != Vertex) goto LAB_005cd436;
    uVar2 = this->m_ptr;
    bVar4 = ((uint)uVar2 & 6) == 2;
  }
  if ((uVar2 & 0xfffffffffffffff8) != 0 && bVar4) {
    pOVar3 = (ON_ComponentStatus *)((uVar2 & 0xfffffffffffffff8) + 0x10);
  }
LAB_005cd436:
  return *pOVar3;
}

Assistant:

const ON_ComponentStatus ON_SubDComponentPtr::Status() const
{
  switch (ComponentType())
  {
  case ON_SubDComponentPtr::Type::Vertex:
    {
      const ON_SubDVertex* vertex = Vertex();
      if ( nullptr != vertex )
        return vertex->m_status;
    }
    break;
  case ON_SubDComponentPtr::Type::Edge:
    {
      const ON_SubDEdge* edge = Edge();
      if ( nullptr != edge )
        return edge->m_status;
    }
    break;
  case ON_SubDComponentPtr::Type::Face:
    {
      const ON_SubDFace* face = Face();
      if ( nullptr != face )
        return face->m_status;
    }
    break;
  case ON_SubDComponentPtr::Type::Unset:
    break;
  }
  return ON_ComponentStatus::NoneSet;
}